

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tristrip.cpp
# Opt level: O3

void __thiscall rw::Geometry::buildTristrips(Geometry *this)

{
  uint32 *puVar1;
  long *plVar2;
  byte *pbVar3;
  undefined8 *puVar4;
  byte bVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  Triangle *pTVar11;
  long ****pppplVar12;
  MeshHeader *pMVar13;
  undefined1 auVar14 [16];
  MeshHeader *pMVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  void *pvVar21;
  ulong uVar22;
  undefined4 *object;
  int iVar23;
  ulong uVar24;
  int iVar25;
  uint uVar26;
  long lVar27;
  long ****pppplVar28;
  ushort uVar29;
  long lVar30;
  char cVar31;
  uint uVar32;
  long lVar33;
  ulong uVar34;
  uint uVar35;
  undefined2 uVar36;
  long lVar37;
  uint uVar38;
  uint32 uVar39;
  long ****pppplVar40;
  long lVar41;
  MeshHeader *pMVar42;
  uint uVar43;
  int iVar44;
  long lVar45;
  ulong uVar46;
  StripMesh smesh;
  int local_88;
  long ***local_78;
  long ***local_70;
  long ***local_68;
  long ***local_60;
  long local_58;
  MaterialList *local_50;
  MeshHeader *local_48;
  MeshHeader *local_40;
  long local_38;
  
  local_50 = &this->matList;
  allocateMeshes(this,(this->matList).numMaterials,0,1);
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/tristrip.cpp line: 575"
  ;
  lVar18 = (*DAT_0014ada8)((long)this->numTriangles * 0x38,0x1000f);
  local_48 = this->meshHeader;
  if (0 < (this->matList).numMaterials) {
    local_40 = local_48 + 1;
    local_58 = 0;
    do {
      local_78 = (long ***)&local_78;
      local_68 = (long ***)&local_68;
      local_88 = 0;
      iVar23 = this->numTriangles;
      local_70 = local_78;
      local_60 = local_68;
      if (0 < iVar23) {
        lVar19 = 0;
        do {
          pTVar11 = this->triangles;
          if (pTVar11[lVar19].matId == (uint16)local_58) {
            lVar33 = (long)local_88;
            local_88 = local_88 + 1;
            lVar33 = lVar33 * 0x38;
            *(uint16 *)(lVar18 + lVar33) = pTVar11[lVar19].v[0];
            *(uint16 *)(lVar18 + 2 + lVar33) = pTVar11[lVar19].v[1];
            *(uint16 *)(lVar18 + 4 + lVar33) = pTVar11[lVar19].v[2];
            *(undefined4 *)(lVar18 + 8 + lVar33) = 0;
            *(undefined4 *)(lVar18 + 0x10 + lVar33) = 0;
            *(undefined4 *)(lVar18 + 0x18 + lVar33) = 0;
            pbVar3 = (byte *)(lVar18 + 0xc + lVar33);
            *pbVar3 = *pbVar3 & 0xf6;
            pbVar3 = (byte *)(lVar18 + 0x14 + lVar33);
            *pbVar3 = *pbVar3 & 0xf6;
            pbVar3 = (byte *)(lVar18 + 0x1c + lVar33);
            *pbVar3 = *pbVar3 & 0xf6;
            pbVar3 = (byte *)(lVar18 + 6 + lVar33);
            *pbVar3 = *pbVar3 & 0xe0;
            *(undefined4 *)(lVar18 + 0x20 + lVar33) = 0xffffffff;
            puVar4 = (undefined8 *)(lVar18 + 0x28 + lVar33);
            *puVar4 = 0;
            puVar4[1] = 0;
            iVar23 = this->numTriangles;
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 < iVar23);
        if (0 < local_88) {
          lVar19 = 0;
          do {
            lVar33 = lVar19 * 0x38 + lVar18;
            lVar27 = 0;
            do {
              bVar5 = *(byte *)(lVar33 + 0xc + lVar27 * 8);
              if ((bVar5 & 1) == 0) {
                uVar22 = 0;
                if (lVar27 != 2) {
                  uVar22 = lVar27 + 1U & 0xffffffff;
                }
                if (0 < (long)local_88) {
                  lVar37 = 0;
                  lVar30 = 0;
                  lVar45 = lVar18;
                  do {
                    lVar41 = 1;
                    cVar31 = (bVar5 & 0xf0) + 1;
                    do {
                      if (((*(byte *)(lVar45 + 4 + lVar41 * 8) & 1) == 0) &&
                         (*(short *)(lVar45 + -2 + lVar41 * 2) == *(short *)(lVar33 + uVar22 * 2)))
                      {
                        lVar20 = 0;
                        if (lVar41 != 3) {
                          lVar20 = lVar41;
                        }
                        if (*(short *)(lVar30 * 0x38 + lVar18 + lVar20 * 2) ==
                            *(short *)(lVar33 + lVar27 * 2)) {
                          *(int *)(lVar33 + 8 + lVar27 * 8) = (int)lVar30;
                          *(char *)(lVar33 + 0xc + lVar27 * 8) = cVar31;
                          lVar37 = lVar37 + lVar18;
                          *(int *)(lVar37 + lVar41 * 8) = (int)lVar19;
                          *(byte *)(lVar37 + 4 + lVar41 * 8) =
                               (*(byte *)(lVar37 + 4 + lVar41 * 8) & 0xf0) + (char)lVar27 * '\x02' +
                               '\x01';
                          goto LAB_00112cb7;
                        }
                      }
                      lVar41 = lVar41 + 1;
                      cVar31 = cVar31 + '\x02';
                    } while (lVar41 != 4);
                    lVar30 = lVar30 + 1;
                    lVar37 = lVar37 + 0x38;
                    lVar45 = lVar45 + 0x38;
                  } while (lVar30 != local_88);
                }
              }
LAB_00112cb7:
              lVar27 = lVar27 + 1;
            } while (lVar27 != 3);
            lVar19 = lVar19 + 1;
          } while (lVar19 < local_88);
          if (0 < local_88) {
            lVar19 = 0;
            do {
              if (*(int *)(lVar18 + 0x20 + lVar19 * 0x38) < 0) {
                lVar33 = lVar18 + lVar19 * 0x38;
                *(int *)(lVar33 + 0x20) = (int)lVar19;
                pppplVar28 = (long ****)(lVar33 + 0x28);
                if ((*(byte *)(lVar33 + 0x1c) & 1) != 0 ||
                    (byte)((*(byte *)(lVar33 + 0x14) & 1) + (*(byte *)(lVar33 + 0xc) & 1)) != '\0')
                {
                  *(long *****)(lVar33 + 0x28) = &local_68;
                  *(long ****)(lVar33 + 0x30) = local_60;
                  *local_60 = (long **)pppplVar28;
                  *(byte *)(lVar33 + 6) = *(byte *)(lVar33 + 6) | 0x10;
                  lVar27 = lVar33;
                  do {
                    lVar45 = 0xc;
                    while (((*(byte *)(lVar27 + lVar45) & 1) == 0 ||
                           (lVar30 = (long)*(int *)(lVar27 + -4 + lVar45) * 0x38,
                           -1 < *(int *)(lVar18 + 0x20 + lVar30)))) {
                      lVar45 = lVar45 + 8;
                      if (lVar45 == 0x24) {
                        local_60 = (long ***)pppplVar28;
                        if (lVar27 != lVar33) {
                          local_60 = (long ***)(lVar27 + 0x28);
                          *(long *****)(lVar27 + 0x28) = &local_68;
                          *(long *****)(lVar27 + 0x30) = pppplVar28;
                          *pppplVar28 = local_60;
                          *(byte *)(lVar27 + 6) = *(byte *)(lVar27 + 6) | 0x10;
                        }
                        goto LAB_00112cf3;
                      }
                    }
                    *(undefined4 *)(lVar18 + lVar30 + 0x20) = *(undefined4 *)(lVar27 + 0x20);
                    bVar5 = *(byte *)(lVar27 + lVar45);
                    *(byte *)(lVar27 + lVar45) = bVar5 ^ 8;
                    pbVar3 = (byte *)(lVar30 + lVar18 + 0xc + (ulong)(bVar5 & 6) * 4);
                    *pbVar3 = *pbVar3 ^ 8;
                    lVar27 = lVar18 + lVar30;
                  } while( true );
                }
                *(long *****)(lVar33 + 0x28) = &local_78;
                *(long ****)(lVar33 + 0x30) = local_70;
                *local_70 = (long **)pppplVar28;
                local_70 = (long ***)pppplVar28;
              }
LAB_00112cf3:
              lVar19 = lVar19 + 1;
            } while (lVar19 < local_88);
          }
        }
      }
      plVar2 = (long *)((long)local_40 + local_58 * 0x18);
      plVar2[2] = (long)local_50->materials[local_58];
      allocLocation =
           "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/tristrip.cpp line: 456"
      ;
      pvVar21 = (void *)(*DAT_0014ada8)((long)(local_88 * 5) * 2,0x1000f);
      *plVar2 = (long)pvVar21;
      memset(pvVar21,0xff,(long)local_88 * 10);
      if ((long ****)local_68 == &local_68) {
        uVar22 = 1;
      }
      else {
        local_38 = lVar18 + 0xc;
        uVar34 = 1;
        pppplVar28 = (long ****)local_68;
        do {
          pppplVar12 = (long ****)*pppplVar28;
          pppplVar40 = pppplVar28 + -5;
          if (((long)pppplVar40 - lVar18 >> 3) * 0x6db6db6db6db6db7 -
              (long)*(int *)(pppplVar28 + -1) == 0) {
            uVar22 = 1;
            uVar24 = 2;
            uVar46 = 0;
            do {
              if ((*(byte *)((long)pppplVar28 + uVar46 * 8 + -0x1c) & 8) != 0) {
                iVar23 = (int)plVar2[1];
                lVar19 = (long)iVar23;
                if (lVar19 == 0) {
                  uVar17 = 0;
                }
                else {
                  uVar17 = iVar23 + 2;
                  *(uint *)(plVar2 + 1) = uVar17;
                }
                iVar44 = (int)uVar46;
                if ((int)uVar34 == 0) {
                  iVar25 = (int)(uVar22 / 3);
                  iVar16 = iVar25 * -3;
                  uVar26 = iVar16 + iVar44 + 1;
                  uVar22 = (ulong)(iVar16 + iVar44 + 2);
                  if (iVar25 * 3 + 1 == iVar44) {
                    uVar22 = 0;
                  }
                  lVar33 = *plVar2;
                  *(undefined2 *)(lVar33 + (ulong)uVar17 * 2) =
                       *(undefined2 *)((long)pppplVar40 + uVar22 * 2);
                  uVar35 = uVar26;
                }
                else {
                  auVar14._8_8_ = 0;
                  auVar14._0_8_ = uVar24;
                  iVar16 = (int)(uVar24 / 3);
                  uVar35 = iVar16 * -3 + iVar44 + 2;
                  lVar33 = *plVar2;
                  *(undefined2 *)(lVar33 + (ulong)uVar17 * 2) =
                       *(undefined2 *)
                        ((long)pppplVar28 +
                        uVar46 * 2 +
                        (SUB168(auVar14 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0xfffffffffffffffe) * -3
                        + -0x24);
                  uVar26 = (int)((uVar24 & 0xffffffff) / 3) * -3 + iVar44 + 3;
                  if (iVar16 * 3 == iVar44) {
                    uVar26 = 0;
                  }
                }
                uVar22 = (ulong)uVar35;
                *(undefined2 *)(lVar33 + (ulong)(uVar17 + 1) * 2) =
                     *(undefined2 *)((long)pppplVar40 + (ulong)uVar26 * 2);
                uVar17 = uVar17 + 2;
                uVar26 = 0xffffffff;
                do {
                  uVar43 = uVar17;
                  uVar17 = ((int)uVar22 + 1U) % 3;
                  uVar38 = (uint)uVar46;
                  uVar35 = (uint)(uVar17 == uVar38);
                  uVar32 = (uint)uVar34;
                  if (uVar26 == uVar35) {
                    *(undefined2 *)(lVar33 + (ulong)uVar43 * 2) =
                         *(undefined2 *)(lVar33 + (ulong)(uVar43 - 2) * 2);
                    uVar43 = uVar43 + 1;
                    uVar32 = (uint)(uVar32 == 0);
                  }
                  uVar46 = uVar46 & 0xffffffff;
                  if (uVar17 == uVar38) {
                    uVar17 = uVar38 + 1;
                    if (uVar38 + 1 == 3) {
                      uVar17 = 0;
                    }
                    uVar36 = *(undefined2 *)((long)pppplVar40 + (ulong)uVar17 * 2);
                  }
                  else {
                    uVar36 = *(undefined2 *)((long)pppplVar40 + uVar46 * 2);
                  }
                  *(undefined2 *)(lVar33 + (ulong)uVar43 * 2) = uVar36;
                  uVar17 = uVar43 + 1;
                  *(uint *)(plVar2 + 1) = uVar17;
                  uVar34 = (ulong)(uVar32 == 0);
                  uVar38 = *(byte *)((long)pppplVar40 + uVar46 * 8 + 0xc) >> 1 & 3;
                  uVar22 = (ulong)uVar38;
                  pppplVar28 = pppplVar40 + uVar46 + 1;
                  pppplVar40 = (long ****)(lVar18 + (long)*(int *)pppplVar28 * 0x38);
                  uVar46 = 0;
                  while ((uVar22 == uVar46 ||
                         (uVar26 = uVar35,
                         (*(byte *)((long)*(int *)pppplVar28 * 0x38 + local_38 + uVar46 * 8) & 8) ==
                         0))) {
                    uVar46 = uVar46 + 1;
                    if (uVar46 == 3) {
                      uVar34 = (ulong)(uVar32 != 0);
                      uVar36 = *(undefined2 *)((long)pppplVar40 + (ulong)((uVar38 + 2) % 3) * 2);
                      *(uint *)(plVar2 + 1) = uVar43 + 2;
                      *(undefined2 *)(lVar33 + (ulong)uVar17 * 2) = uVar36;
                      if (iVar23 != 0) {
                        *(undefined2 *)(lVar33 + lVar19 * 2) =
                             *(undefined2 *)(lVar33 + -2 + lVar19 * 2);
                        *(undefined2 *)(lVar33 + 2 + lVar19 * 2) =
                             *(undefined2 *)(lVar33 + 4 + lVar19 * 2);
                      }
                      goto LAB_001130f4;
                    }
                  }
                } while( true );
              }
              uVar46 = uVar46 + 1;
              uVar22 = uVar22 + 1;
              uVar24 = uVar24 + 1;
            } while (uVar46 != 3);
          }
LAB_001130f4:
          pppplVar40 = (long ****)local_68;
          pppplVar28 = pppplVar12;
        } while (pppplVar12 != &local_68);
        do {
          pppplVar28 = (long ****)*pppplVar40;
          uVar22 = uVar34;
          if ((*(byte *)((long)pppplVar40 + -0xc) >> 3 & 1) == 0 &&
              (byte)((*(byte *)((long)pppplVar40 + -0x14) >> 3 & 1) +
                    ((*(uint *)((long)pppplVar40 + -0x1c) >> 3 & 1) != 0)) == '\0') {
            uVar17 = *(uint *)(plVar2 + 1);
            lVar19 = *plVar2;
            if ((ulong)uVar17 == 0) {
              uVar26 = 0;
            }
            else {
              *(undefined2 *)(lVar19 + (ulong)uVar17 * 2) =
                   *(undefined2 *)(lVar19 + (ulong)(uVar17 - 1) * 2);
              uVar26 = uVar17 + 2;
              *(undefined2 *)(lVar19 + (ulong)(uVar17 + 1) * 2) =
                   *(undefined2 *)((long)pppplVar40 + (ulong)((int)uVar34 == 0) * 2 + -0x28);
            }
            uVar22 = (ulong)((int)uVar34 == 0);
            *(undefined2 *)(lVar19 + (ulong)uVar26 * 2) =
                 *(undefined2 *)((long)pppplVar40 + uVar22 * 2 + -0x28);
            *(undefined2 *)(lVar19 + (ulong)(uVar26 + 1) * 2) =
                 *(undefined2 *)((long)pppplVar40 + uVar34 * 2 + -0x28);
            uVar36 = *(undefined2 *)((long)pppplVar40 + -0x24);
            *(uint *)(plVar2 + 1) = uVar26 + 3;
            *(undefined2 *)(lVar19 + (ulong)(uVar26 + 2) * 2) = uVar36;
          }
          uVar34 = uVar22;
          pppplVar40 = pppplVar28;
        } while (pppplVar28 != &local_68);
      }
      if ((long ****)local_78 == &local_78) {
        uVar17 = *(uint *)(plVar2 + 1);
      }
      else {
        lVar19 = *plVar2;
        uVar17 = *(uint *)(plVar2 + 1);
        pppplVar28 = (long ****)local_78;
        do {
          pppplVar40 = (long ****)*pppplVar28;
          if (uVar17 == 0) {
            uVar26 = 0;
          }
          else {
            *(undefined2 *)(lVar19 + (ulong)uVar17 * 2) =
                 *(undefined2 *)(lVar19 + (ulong)(uVar17 - 1) * 2);
            uVar26 = uVar17 + 2;
            *(undefined2 *)(lVar19 + (ulong)(uVar17 + 1) * 2) =
                 *(undefined2 *)((long)pppplVar28 + (ulong)((int)uVar22 == 0) * 2 + -0x28);
          }
          uVar34 = (ulong)((int)uVar22 == 0);
          *(undefined2 *)(lVar19 + (ulong)uVar26 * 2) =
               *(undefined2 *)((long)pppplVar28 + uVar34 * 2 + -0x28);
          *(undefined2 *)(lVar19 + (ulong)(uVar26 + 1) * 2) =
               *(undefined2 *)((long)pppplVar28 + uVar22 * 2 + -0x28);
          uVar17 = uVar26 + 3;
          *(undefined2 *)(lVar19 + (ulong)(uVar26 + 2) * 2) =
               *(undefined2 *)((long)pppplVar28 + -0x24);
          pppplVar28 = pppplVar40;
          uVar22 = uVar34;
        } while (pppplVar40 != &local_78);
        *(uint *)(plVar2 + 1) = uVar17;
      }
      puVar1 = &this->meshHeader->totalIndices;
      *puVar1 = *puVar1 + uVar17;
      local_58 = local_58 + 1;
    } while (local_58 < (this->matList).numMaterials);
  }
  (*DAT_0014ada0)(lVar18);
  pMVar42 = this->meshHeader;
  this->meshHeader = (MeshHeader *)0x0;
  allocateMeshes(this,(uint)pMVar42->numMeshes,pMVar42->totalIndices,0);
  pMVar15 = local_48;
  pMVar13 = this->meshHeader;
  pMVar13->flags = 1;
  if (pMVar42->numMeshes != 0) {
    lVar18 = 0x10;
    uVar22 = 0;
    pvVar21 = *(void **)(pMVar13 + 1);
    do {
      *(undefined8 *)((long)&pMVar13[1].flags + lVar18) =
           *(undefined8 *)((long)&pMVar15[1].flags + lVar18);
      uVar17 = *(uint *)((long)&pMVar15->totalIndices + lVar18);
      *(uint *)((long)&pMVar13->totalIndices + lVar18) = uVar17;
      *(void **)((long)&pMVar13->flags + lVar18) = pvVar21;
      memcpy(pvVar21,*(void **)((long)&pMVar15->flags + lVar18),(ulong)uVar17 * 2);
      (*DAT_0014ada0)(*(undefined8 *)((long)&pMVar15->flags + lVar18));
      uVar22 = uVar22 + 1;
      lVar18 = lVar18 + 0x18;
      pvVar21 = (void *)((long)pvVar21 + (ulong)uVar17 * 2);
    } while (uVar22 < pMVar42->numMeshes);
  }
  (*DAT_0014ada0)(pMVar42);
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/tristrip.cpp line: 632"
  ;
  pvVar21 = (void *)(*DAT_0014ada8)((long)this->numTriangles);
  uVar17 = 0;
  memset(pvVar21,0,(long)this->numTriangles);
  if (this->meshHeader->numMeshes != 0) {
    pMVar42 = this->meshHeader + 1;
    do {
      uVar26 = MaterialList::findIndex(local_50,*(Material **)(pMVar42 + 1));
      uVar39 = pMVar42->totalIndices;
      if (uVar39 != 2) {
        uVar22 = 0;
        uVar35 = 0;
LAB_001133b6:
        lVar18 = *(long *)pMVar42;
        iVar23 = (int)uVar22;
        uVar6 = *(ushort *)(lVar18 + (ulong)(uVar35 + iVar23) * 2);
        uVar35 = uVar35 ^ 1;
        uVar7 = *(ushort *)(lVar18 + (ulong)(uVar35 + iVar23) * 2);
        uVar8 = *(ushort *)(lVar18 + (ulong)(iVar23 + 2) * 2);
        iVar23 = this->numVertices;
        if ((((int)(uint)uVar6 < iVar23) && ((int)(uint)uVar7 < iVar23)) &&
           ((int)(uint)uVar8 < iVar23)) {
          if (((uVar6 == uVar7) || (uVar6 == uVar8)) || (uVar7 == uVar8)) goto LAB_001134aa;
          if (0 < (long)this->numTriangles) {
            pTVar11 = this->triangles;
            lVar18 = 0;
            do {
              if ((*(char *)((long)pvVar21 + lVar18) == '\0') && (uVar26 == pTVar11[lVar18].matId))
              {
                uVar9 = pTVar11[lVar18].v[0];
                uVar29 = pTVar11[lVar18].v[1];
                uVar10 = pTVar11[lVar18].v[2];
                if ((((uVar9 == uVar6) && ((uVar29 == uVar7 && (uVar29 = uVar7, uVar10 == uVar8))))
                    || ((uVar29 == uVar6 && ((uVar10 == uVar7 && (uVar9 == uVar8)))))) ||
                   ((uVar10 == uVar6 && ((uVar9 == uVar7 && (uVar29 == uVar8))))))
                goto LAB_001134a0;
              }
              lVar18 = lVar18 + 1;
              if (this->numTriangles == lVar18) break;
            } while( true );
          }
        }
        else {
          fprintf(_stderr,"triangle %d %d %d out of range (%d)\n");
        }
        goto LAB_00113528;
      }
LAB_001134ba:
      pMVar42 = (MeshHeader *)&pMVar42[1].totalIndices;
      uVar17 = uVar17 + 1;
    } while (uVar17 < this->meshHeader->numMeshes);
  }
  if (0 < (long)this->numTriangles) {
    lVar18 = 0;
    do {
      if (*(char *)((long)pvVar21 + lVar18) == '\0') {
LAB_00113528:
        buildTristrips();
        allocLocation =
             "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/world.cpp line: 24"
        ;
        object = (undefined4 *)(*Engine::memfuncs)((long)World::s_plglist,0x3000b);
        if (object == (undefined4 *)0x0) {
          World::create();
        }
        else {
          World::numAllocated = World::numAllocated + 1;
          *object = 7;
          *(undefined8 *)(object + 2) = 0;
          *(undefined4 **)(object + 4) = object + 4;
          *(undefined4 **)(object + 6) = object + 4;
          *(undefined4 **)(object + 8) = object + 8;
          *(undefined4 **)(object + 10) = object + 8;
          *(undefined4 **)(object + 0xc) = object + 0xc;
          *(undefined4 **)(object + 0xe) = object + 0xc;
          PluginList::construct((PluginList *)&World::s_plglist,object);
        }
        return;
      }
      lVar18 = lVar18 + 1;
    } while (this->numTriangles != lVar18);
  }
  (*DAT_0014ada0)(pvVar21);
  return;
LAB_001134a0:
  *(undefined1 *)((long)pvVar21 + lVar18) = 1;
  uVar39 = pMVar42->totalIndices;
LAB_001134aa:
  uVar22 = uVar22 + 1;
  if (uVar39 - 2 <= uVar22) goto LAB_001134ba;
  goto LAB_001133b6;
}

Assistant:

void
Geometry::buildTristrips(void)
{
	int32 i;
	uint16 *indices;
	MeshHeader *header;
	Mesh *ms, *md;
	StripMesh smesh;

//	trace("%ld\n", sizeof(StripNode));

	this->allocateMeshes(matList.numMaterials, 0, 1);

	smesh.nodes = rwNewT(StripNode, this->numTriangles, MEMDUR_FUNCTION | ID_GEOMETRY);
	ms = this->meshHeader->getMeshes();
	for(int32 i = 0; i < this->matList.numMaterials; i++){
		smesh.loneNodes.init();
		smesh.endNodes.init();
		collectFaces(this, &smesh, i);
		connectNodesPreserve(&smesh);
		buildStrips(&smesh);
printSmesh(&smesh);
//trace("-------\n");
//printLone(&smesh);
//trace("-------\n");
//printEnds(&smesh);
//trace("-------\n");
		// TODO: make this work
//		tunnel(&smesh);
//trace("-------\n");
//printEnds(&smesh);

		ms[i].material = this->matList.materials[i];
		makeMesh(&smesh, &ms[i]);
		this->meshHeader->totalIndices += ms[i].numIndices;
	}
	rwFree(smesh.nodes);

	/* Now re-allocate and copy data */
	header = this->meshHeader;
	this->meshHeader = nil;
	this->allocateMeshes(header->numMeshes, header->totalIndices, 0);
	this->meshHeader->flags = MeshHeader::TRISTRIP;
	md = this->meshHeader->getMeshes();
	indices = md->indices;
	for(i = 0; i < header->numMeshes; i++){
		md[i].material = ms[i].material;
		md[i].numIndices = ms[i].numIndices;
		md[i].indices = indices;
		indices += md[i].numIndices;
		memcpy(md[i].indices, ms[i].indices, md[i].numIndices*sizeof(uint16));
		rwFree(ms[i].indices);
	}
	rwFree(header);

	verifyMesh(this);
}